

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# extrema.c
# Opt level: O2

size_t find_maximum(uint8_t *array,size_t length)

{
  size_t sVar1;
  byte bVar2;
  size_t n;
  size_t sVar3;
  
  sVar1 = 0;
  bVar2 = 0;
  for (sVar3 = 0; length != sVar3; sVar3 = sVar3 + 1) {
    if (bVar2 < array[sVar3]) {
      bVar2 = array[sVar3];
      sVar1 = sVar3;
    }
  }
  return sVar1;
}

Assistant:

size_t find_maximum(const uint8_t* array, const size_t length) {
  size_t res = 0;
  uint8_t max = 0;
  for (size_t n = 0; n < length; n++) {
    if (array[n] > max) {
      max = array[n];
      res = n;
    }
  }
  return res;
}